

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O1

void __thiscall KeySequentialExecutor::run(KeySequentialExecutor *this)

{
  impl_type *piVar1;
  reactor *prVar2;
  bool bVar3;
  undefined1 local_78 [8];
  epoll_data_t eStack_70;
  undefined1 local_68 [8];
  undefined8 local_60;
  storage1<boost::_bi::value<KeySequentialExecutor_*>_> local_58;
  error_category *peStack_50;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  value<KeySequentialExecutor_*> local_28;
  error_category *peStack_20;
  
  startWorkers(this);
  local_68 = (undefined1  [8])work;
  local_60 = 0;
  local_58.a1_.t_ = (value<KeySequentialExecutor_*>)(value<KeySequentialExecutor_*>)this;
  boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>>::
  async_wait<boost::_bi::bind_t<void,boost::_mfi::mf1<void,KeySequentialExecutor,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<KeySequentialExecutor*>,boost::arg<1>(*)()>>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>> *)
             (this->m_wrkTimer).impl_.service_,&(this->m_wrkTimer).impl_.implementation_,
             (bind_t<void,_boost::_mfi::mf1<void,_KeySequentialExecutor,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<KeySequentialExecutor_*>,_boost::arg<1>_(*)()>_>
              *)local_68,&(this->m_wrkTimer).impl_.executor_);
  local_78._0_4_ = 0;
  local_78._4_4_ = local_78._4_4_ & 0xffffff00;
  eStack_70.fd = 0x138938;
  eStack_70.u64._4_4_ = 0;
  boost::asio::detail::scheduler::run((this->m_ios).impl_,(error_code *)local_78);
  if (local_78[4] == true) {
    local_28.t_ = (KeySequentialExecutor *)CONCAT44(local_78._4_4_,local_78._0_4_);
    peStack_20 = (error_category *)CONCAT44(eStack_70.u64._4_4_,eStack_70.fd);
    std::runtime_error::runtime_error((runtime_error *)local_68,"");
    local_68 = (undefined1  [8])&PTR__system_error_00138908;
    local_58.a1_.t_ = (value<KeySequentialExecutor_*>)(value<KeySequentialExecutor_*>)local_28.t_;
    peStack_50 = peStack_20;
    local_48._M_p = (pointer)&local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_68);
  }
  stopWorkers(this);
  piVar1 = (this->m_ios).impl_;
  local_68 = (undefined1  [8])&piVar1->mutex_;
  bVar3 = (piVar1->mutex_).enabled_ == true;
  if (bVar3) {
    pthread_mutex_lock((pthread_mutex_t *)&(piVar1->mutex_).mutex_);
  }
  local_60._0_1_ = bVar3;
  piVar1->stopped_ = true;
  if (*(bool *)((long)local_68 + 0x30) == true) {
    boost::asio::detail::posix_event::
    signal_all<boost::asio::detail::conditionally_enabled_mutex::scoped_lock>
              (&(piVar1->wakeup_event_).event_,(scoped_lock *)local_68);
  }
  unique0x1000034f = (select_interrupter *)CONCAT44(eStack_70.fd,local_78._4_4_);
  if ((piVar1->task_interrupted_ == false) &&
     (prVar2 = piVar1->task_,
     unique0x10000357 = (select_interrupter *)CONCAT44(eStack_70.fd,local_78._4_4_),
     prVar2 != (reactor *)0x0)) {
    piVar1->task_interrupted_ = true;
    local_78._0_4_ = 0x80000009;
    unique0x00004780 = &prVar2->interrupter_;
    epoll_ctl(prVar2->epoll_fd_,3,(prVar2->interrupter_).read_descriptor_,(epoll_event *)local_78);
  }
  if (local_60._0_1_ == true) {
    pthread_mutex_unlock((pthread_mutex_t *)((long)local_68 + 8));
  }
  boost::latch::count_down(&this->m_latch);
  return;
}

Assistant:

void KeySequentialExecutor::run()
{
    //std::cout << "\"" << std::this_thread::get_id() << "\": Starting executor ..." << std::endl;
    startWorkers();
    m_wrkTimer.async_wait(boost::bind(&KeySequentialExecutor::work, this, boost::asio::placeholders::error));
    //std::cout << "\"" << std::this_thread::get_id() << "\": Executor is up and running ..." << std::endl;
    m_ios.run();
    stopWorkers();
    m_ios.stop();
    m_latch.count_down();
    //std::cout << "\"" << std::this_thread::get_id() << "\": Executor is stopped" << std::endl;
}